

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

bool __thiscall re2::SparseArray<int>::has_index(SparseArray<int> *this,int i)

{
  uint uVar1;
  IndexValue *pIVar2;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var3;
  bool bVar4;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                  ,0x15e,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  pIVar2 = (this->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  _Var3._M_head_impl.len_ = (Deleter)0;
  if (pIVar2 != (IndexValue *)0x0) {
    _Var3._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>.
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>.
         _M_head_impl;
  }
  if (i < (int)_Var3._M_head_impl.len_) {
    uVar1 = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)i];
    if (uVar1 < (uint)this->size_) {
      bVar4 = pIVar2[(int)uVar1].index_ == i;
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  __assert_fail("i < max_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/sparse_array.h"
                ,0x15f,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  assert(i >= 0);
  assert(i < max_size());
  if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_[i] < 0.
  return (uint32_t)sparse_[i] < (uint32_t)size_ &&
         dense_[sparse_[i]].index_ == i;
}